

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_helpers.cc
# Opt level: O3

int google::protobuf::compiler::java::GetExperimentalJavaFieldType(FieldDescriptor *field)

{
  FieldDescriptor FVar1;
  byte bVar2;
  char cVar3;
  bool bVar4;
  JavaType JVar5;
  uint uVar6;
  long lVar7;
  Descriptor *type;
  FieldDescriptor *pFVar8;
  LogMessage *this;
  int iVar9;
  uint uVar10;
  uint uVar11;
  LogMessageFatal aLStack_28 [16];
  
  bVar2 = google::protobuf::FieldDescriptor::is_required();
  uVar10 = (uint)bVar2 * 0x100;
  uVar11 = uVar10;
  if (field[2] == (FieldDescriptor)0x9) {
    lVar7 = google::protobuf::internal::ExtensionSet::GetMessage
                      ((int)*(undefined8 *)(field + 0x48) + 0x10,(MessageLite *)(ulong)pb::java);
    if ((*(int *)(lVar7 + 0x1c) == 2) || (*(int *)(*(long *)(field + 0x48) + 0x3c) == 2)) {
      uVar11 = uVar10 | 0x200;
    }
    else {
      uVar11 = uVar10 + 0x200;
      if (*(char *)(*(long *)(*(long *)(field + 0x10) + 0x80) + 0xa2) == '\0') {
        uVar11 = uVar10;
      }
    }
  }
  cVar3 = google::protobuf::FieldDescriptor::is_required();
  if (cVar3 == '\0') {
    JVar5 = GetJavaType(field);
    if (JVar5 == JAVATYPE_MESSAGE) {
      type = (Descriptor *)google::protobuf::FieldDescriptor::message_type();
      bVar4 = HasRequiredFields(type);
      if (bVar4) goto LAB_00286f7d;
    }
  }
  else {
LAB_00286f7d:
    uVar11 = uVar11 | 0x400;
  }
  cVar3 = google::protobuf::internal::cpp::HasHasbit(field);
  uVar10 = uVar11 + 0x1000;
  if (cVar3 == '\0') {
    uVar10 = uVar11;
  }
  JVar5 = GetJavaType(field);
  if (JVar5 == JAVATYPE_ENUM) {
    lVar7 = google::protobuf::internal::ExtensionSet::GetMessage
                      ((int)*(undefined8 *)(field + 0x48) + 0x10,(MessageLite *)(ulong)pb::java);
    if ((*(char *)(lVar7 + 0x18) == '\0') &&
       (lVar7 = google::protobuf::FieldDescriptor::enum_type(), lVar7 != 0)) {
      google::protobuf::FieldDescriptor::enum_type();
      cVar3 = google::protobuf::EnumDescriptor::is_closed();
      if (cVar3 != '\0') {
        uVar10 = uVar10 | 0x800;
      }
    }
    else {
      uVar10 = uVar10 | 0x800;
    }
  }
  if ((field[2] != (FieldDescriptor)0xb) ||
     (cVar3 = google::protobuf::FieldDescriptor::is_map_message_type(), cVar3 == '\0')) {
    cVar3 = google::protobuf::FieldDescriptor::is_packed();
    if (cVar3 == '\0') {
      FVar1 = field[1];
      if (0xbf < (byte)FVar1 != (bool)(((byte)FVar1 & 0x20) >> 5)) {
        GetExperimentalJavaFieldType();
        goto LAB_002871b3;
      }
      if (((byte)FVar1 & 0x20) == 0) {
        bVar4 = IsRealOneof(field);
        FVar1 = field[2];
        uVar11 = (uint)(byte)FVar1;
        if (bVar4) {
          iVar9 = 0x11;
          if (uVar11 != 10) {
            if ((byte)FVar1 < 10) {
              iVar9 = uVar11 - 1;
            }
            else {
              iVar9 = uVar11 - 2;
            }
          }
          uVar6 = iVar9 + 0x33;
        }
        else {
          uVar6 = 0x11;
          if (uVar11 != 10) {
            if ((byte)FVar1 < 10) {
              uVar6 = uVar11 - 1;
            }
            else {
              uVar6 = uVar11 - 2;
            }
          }
        }
      }
      else {
        FVar1 = field[2];
        uVar6 = 0x31;
        if (FVar1 != (FieldDescriptor)0xa) {
          uVar6 = (byte)FVar1 + 0x12 + ((byte)FVar1 < 10 | 0xfffffffe);
        }
      }
    }
    else {
      FVar1 = field[2];
      iVar9 = 0x22;
      if ((8 < (byte)FVar1) && (iVar9 = 0x1e, (byte)FVar1 < 0xd)) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (aLStack_28,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/compiler/java/internal_helpers.cc"
                   ,0x47);
        this = (LogMessage *)
               absl::lts_20240722::log_internal::LogMessage::operator<<
                         ((LogMessage *)aLStack_28,(string *)(*(long *)(field + 8) + 0x20));
        absl::lts_20240722::log_internal::LogMessage::operator<<
                  (this,(char (*) [18])" can\'t be packed.");
LAB_002871b3:
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_28);
      }
      uVar6 = iVar9 + (uint)(byte)FVar1;
    }
    return uVar6 | uVar10;
  }
  pFVar8 = MapValueField(field);
  lVar7 = google::protobuf::internal::ExtensionSet::GetMessage
                    ((int)*(undefined8 *)(pFVar8 + 0x48) + 0x10,(MessageLite *)(ulong)pb::java);
  if ((*(char *)(lVar7 + 0x18) == '\0') &&
     (lVar7 = google::protobuf::FieldDescriptor::enum_type(), lVar7 != 0)) {
    google::protobuf::FieldDescriptor::enum_type();
    cVar3 = google::protobuf::EnumDescriptor::is_closed();
    if (cVar3 == '\0') goto LAB_002870a3;
  }
  google::protobuf::FieldDescriptor::message_type();
  pFVar8 = (FieldDescriptor *)google::protobuf::Descriptor::map_value();
  JVar5 = GetJavaType(pFVar8);
  if (JVar5 == JAVATYPE_ENUM) {
    uVar10 = uVar10 | 0x800;
  }
LAB_002870a3:
  return uVar10 | 0x32;
}

Assistant:

int GetExperimentalJavaFieldType(const FieldDescriptor* field) {
  static const int kMapFieldType = 50;
  static const int kOneofFieldTypeOffset = 51;

  static const int kRequiredBit = 0x100;
  static const int kUtf8CheckBit = 0x200;
  static const int kCheckInitialized = 0x400;
  static const int kLegacyEnumIsClosedBit = 0x800;
  static const int kHasHasBit = 0x1000;
  int extra_bits = field->is_required() ? kRequiredBit : 0;
  if (field->type() == FieldDescriptor::TYPE_STRING && CheckUtf8(field)) {
    extra_bits |= kUtf8CheckBit;
  }
  if (field->is_required() || (GetJavaType(field) == JAVATYPE_MESSAGE &&
                               HasRequiredFields(field->message_type()))) {
    extra_bits |= kCheckInitialized;
  }
  if (HasHasbit(field)) {
    extra_bits |= kHasHasBit;
  }
  if (GetJavaType(field) == JAVATYPE_ENUM && !SupportUnknownEnumValue(field)) {
    extra_bits |= kLegacyEnumIsClosedBit;
  }

  if (field->is_map()) {
    if (!SupportUnknownEnumValue(MapValueField(field))) {
      const FieldDescriptor* value = field->message_type()->map_value();
      if (GetJavaType(value) == JAVATYPE_ENUM) {
        extra_bits |= kLegacyEnumIsClosedBit;
      }
    }
    return kMapFieldType | extra_bits;
  } else if (field->is_packed()) {
    return GetExperimentalJavaFieldTypeForPacked(field) | extra_bits;
  } else if (field->is_repeated()) {
    return GetExperimentalJavaFieldTypeForRepeated(field) | extra_bits;
  } else if (IsRealOneof(field)) {
    return (GetExperimentalJavaFieldTypeForSingular(field) +
            kOneofFieldTypeOffset) |
           extra_bits;
  } else {
    return GetExperimentalJavaFieldTypeForSingular(field) | extra_bits;
  }
}